

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationarrow.cpp
# Opt level: O0

void __thiscall QtMWidgets::NavigationArrow::mouseReleaseEvent(NavigationArrow *this,QMouseEvent *e)

{
  MouseButton MVar1;
  NavigationArrowPrivate *__addr_len;
  NavigationArrowPrivate *pNVar2;
  sockaddr *__addr;
  int __fd;
  byte local_39;
  QPoint local_30;
  QRect local_28;
  QEvent *local_18;
  QMouseEvent *e_local;
  NavigationArrow *this_local;
  
  local_18 = (QEvent *)e;
  e_local = (QMouseEvent *)this;
  MVar1 = QSinglePointEvent::button((QSinglePointEvent *)e);
  __fd = (int)e;
  if (MVar1 == LeftButton) {
    __addr_len = QScopedPointer<QtMWidgets::NavigationArrowPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationArrowPrivate>_>
                 ::operator->(&this->d);
    local_39 = 0;
    if ((__addr_len->leftButtonPressed & 1U) != 0) {
      local_28 = QWidget::rect(&this->super_QWidget);
      local_30 = QMouseEvent::pos((QMouseEvent *)local_18);
      __fd = (int)&local_30;
      local_39 = QRect::contains((QPoint *)&local_28,SUB81(&local_30,0));
    }
    if ((local_39 & 1) != 0) {
      clicked(this);
    }
    pNVar2 = QScopedPointer<QtMWidgets::NavigationArrowPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationArrowPrivate>_>
             ::operator->(&this->d);
    pNVar2->leftButtonPressed = false;
    QEvent::accept(local_18,__fd,__addr,(socklen_t *)__addr_len);
  }
  else {
    QEvent::ignore(local_18);
  }
  return;
}

Assistant:

void
NavigationArrow::mouseReleaseEvent( QMouseEvent * e )
{
	if( e->button() == Qt::LeftButton )
	{
		if( d->leftButtonPressed && rect().contains( e->pos() ) )
			emit clicked();

		d->leftButtonPressed = false;

		e->accept();
	}
	else
		e->ignore();
}